

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int find_lexical_decl(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_idx,
                     BOOL check_catch_var)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint in_EAX;
  long lVar4;
  void *pvVar5;
  
  while (-1 < (int)name) {
    lVar2 = (ctx->promise_ctor).tag;
    lVar4 = lVar2 + (ulong)name * 0x10;
    if ((*(int *)(lVar2 + (ulong)name * 0x10) == (int)fd) &&
       ((uVar1 = *(uint *)(lVar4 + 0xc), (uVar1 & 2) != 0 ||
        ((scope_idx != 0 && ((uVar1 & 0x78) == 0x18)))))) {
      bVar3 = false;
      in_EAX = name;
    }
    else {
      name = *(uint *)(lVar4 + 8);
      bVar3 = true;
    }
    if (!bVar3) {
      return in_EAX;
    }
  }
  if (*(int *)&ctx->array_shape == 0) {
    return -1;
  }
  if (*(int *)((long)&ctx->array_shape + 4) != 0) {
    return -1;
  }
  lVar4 = (long)*(int *)((long)&(ctx->iterator_proto).u + 4);
  if (0 < lVar4) {
    pvVar5 = (ctx->async_iterator_proto).u.ptr;
    do {
      if (*(int *)((long)pvVar5 + 0xc) == (int)fd) goto LAB_00157b75;
      pvVar5 = (void *)((long)pvVar5 + 0x10);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  pvVar5 = (void *)0x0;
LAB_00157b75:
  if ((pvVar5 != (void *)0x0) && ((*(byte *)((long)pvVar5 + 4) & 2) != 0)) {
    return 0x40000000;
  }
  return -1;
}

Assistant:

static int find_lexical_decl(JSContext *ctx, JSFunctionDef *fd, JSAtom name,
                             int scope_idx, BOOL check_catch_var)
{
    while (scope_idx >= 0) {
        JSVarDef *vd = &fd->vars[scope_idx];
        if (vd->var_name == name &&
            (vd->is_lexical || (vd->var_kind == JS_VAR_CATCH &&
                                check_catch_var)))
            return scope_idx;
        scope_idx = vd->scope_next;
    }

    if (fd->is_eval && fd->eval_type == JS_EVAL_TYPE_GLOBAL) {
        if (find_lexical_global_var(fd, name))
            return GLOBAL_VAR_OFFSET;
    }
    return -1;
}